

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall Matrix4f::transpose(Matrix4f *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_1c;
  undefined4 local_18;
  int j;
  int i;
  float temp;
  Matrix4f *this_local;
  
  for (local_18 = 0; local_1c = local_18, local_18 < 3; local_18 = local_18 + 1) {
    while (local_1c = local_1c + 1, local_1c < 4) {
      pfVar3 = operator()(this,local_18,local_1c);
      fVar1 = *pfVar3;
      pfVar3 = operator()(this,local_1c,local_18);
      fVar2 = *pfVar3;
      pfVar3 = operator()(this,local_18,local_1c);
      *pfVar3 = fVar2;
      pfVar3 = operator()(this,local_1c,local_18);
      *pfVar3 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix4f::transpose()
{
	float temp;

	for( int i = 0; i < 3; ++i )
	{
		for( int j = i + 1; j < 4; ++j )
		{
			temp = ( *this )( i, j );
			( * this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}